

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O0

Aig_ManPack_t * Aig_ManPackStart(Aig_Man_t *pAig)

{
  Aig_ManPack_t *p_00;
  Aig_ManPack_t *p;
  Aig_Man_t *pAig_local;
  
  p_00 = Aig_ManPackAlloc(pAig);
  Aig_ManPackSetRandom(p_00);
  Aig_ManPackSimulate(p_00);
  Aig_ManPackPrintStats(p_00);
  return p_00;
}

Assistant:

Aig_ManPack_t * Aig_ManPackStart( Aig_Man_t * pAig )
{
    Aig_ManPack_t * p;
    p = Aig_ManPackAlloc( pAig );
    Aig_ManPackSetRandom( p );
    Aig_ManPackSimulate( p );
    Aig_ManPackPrintStats( p );
    return p;
}